

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MassDensityR.cpp
# Opt level: O1

void __thiscall OpenMD::MassDensityR::process(MassDensityR *this)

{
  double *pdVar1;
  pointer pOVar2;
  pointer pdVar3;
  double dVar4;
  uint i;
  int iVar5;
  int iVar6;
  StuntDouble *pSVar7;
  int whichFrame;
  long lVar8;
  double tmp;
  int ii;
  Vector3d CenterOfMass;
  DumpReader reader;
  SelectionSet local_1308;
  SelectionEvaluator *local_12f0;
  Thermo *local_12e8;
  int local_12dc;
  pointer local_12d8 [4];
  double local_12b8 [3];
  Vector3d local_12a0;
  DumpReader local_1288;
  
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  iVar5 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar5 / (this->super_StaticAnalyser).step_;
  if (0 < iVar5) {
    local_12e8 = &this->thermo_;
    local_12f0 = &this->evaluator_;
    whichFrame = 0;
    do {
      DumpReader::readFrame(&local_1288,whichFrame);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      Thermo::getCom(&local_12a0,local_12e8);
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1308,local_12f0);
        lVar8 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8
                     ),(vector<bool,_std::allocator<bool>_> *)
                       ((long)&((local_1308.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar8));
          lVar8 = lVar8 + 0x28;
        } while (lVar8 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1308.bitsets_);
      }
      pSVar7 = SelectionManager::beginSelected(&this->seleMan_,&local_12dc);
      while (pSVar7 != (StuntDouble *)0x0) {
        lVar8 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
        local_12b8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
        pdVar1 = (double *)(lVar8 + (long)pSVar7->localIndex_ * 0x18);
        local_12b8[0] = *pdVar1;
        local_12b8[1] = pdVar1[1];
        local_12d8[0] = (pointer)0x0;
        local_12d8[1] = (pointer)0x0;
        local_12d8[2] = (pointer)0x0;
        lVar8 = 0;
        do {
          local_12d8[lVar8] =
               (pointer)(local_12a0.super_Vector<double,_3U>.data_[lVar8] - local_12b8[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_12d8[2];
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = local_12d8[0];
        local_1308.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = local_12d8[1];
        dVar4 = 0.0;
        lVar8 = 0;
        do {
          pOVar2 = (&local_1308.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start)[lVar8];
          dVar4 = dVar4 + (double)pOVar2 * (double)pOVar2;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        if (dVar4 < this->len_) {
          iVar6 = (int)(dVar4 / this->deltaR_);
          pdVar3 = (this->massR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar6] = pSVar7->mass_ + pdVar3[iVar6];
        }
        pSVar7 = SelectionManager::nextSelected(&this->seleMan_,&local_12dc);
      }
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_;
    } while (whichFrame < iVar5);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void MassDensityR::process() {
    StuntDouble* sd;
    int ii;

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo_.getCom();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // determine which StuntDouble belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos      = CenterOfMass - sd->getPos();
        RealType distance = pos.length();
        RealType mass     = sd->getMass();

        if (distance < len_) {
          int binNo = int(distance / deltaR_);
          massR_[binNo] += mass;
        }
      }
    }
    writeMassDensityR();
  }